

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsTask.h
# Opt level: O0

bool __thiscall HighsTask::isCancelled(HighsTask *this)

{
  long in_RDI;
  uintptr_t state;
  memory_order __b;
  
  std::operator&(memory_order_relaxed,__memory_order_mask);
  return (*(ulong *)(in_RDI + 0x38) & 2) != 0;
}

Assistant:

bool isCancelled() const {
    uintptr_t state = metadata.stealer.load(std::memory_order_relaxed);
    return state & kCancelFlag;
  }